

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

QCborValueConstRef __thiscall
QCborContainerPrivate::findCborMapKey<QLatin1String>(QCborContainerPrivate *this,QLatin1String key)

{
  bool bVar1;
  long lVar2;
  QCborValueConstRef QVar3;
  
  for (lVar2 = 1; lVar2 - 1U < (ulong)(this->elements).d.size; lVar2 = lVar2 + 2) {
    bVar1 = stringEqualsElement<QLatin1String>(this,lVar2 - 1U,key);
    if (bVar1) break;
  }
  QVar3.i = lVar2;
  QVar3.d = this;
  return QVar3;
}

Assistant:

QCborValueConstRef findCborMapKey(KeyType key)
    {
        qsizetype i = 0;
        for ( ; i < elements.size(); i += 2) {
            const auto &e = elements.at(i);
            bool equals;
            if constexpr (std::is_same_v<std::decay_t<KeyType>, QCborValue>) {
                equals = (compareElement(i, key, QtCbor::Comparison::ForEquality) == 0);
            } else if constexpr (std::is_integral_v<KeyType>) {
                equals = (e.type == QCborValue::Integer && e.value == key);
            } else {
                // assume it's a string
                equals = stringEqualsElement(i, key);
            }
            if (equals)
                break;
        }
        return { this, i + 1 };
    }